

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cmdline.c
# Opt level: O1

ssize_t get_argument(archive_string *as,char *p)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  as->length = 0;
  pbVar5 = (byte *)(p + -1);
  do {
    pbVar4 = pbVar5 + 1;
    pbVar5 = pbVar5 + 1;
  } while (*pbVar4 == 0x20);
  do {
    bVar2 = *pbVar5;
    pbVar4 = (byte *)0x1;
    if (bVar2 < 0x5c) {
      if (bVar2 != 0x22) {
        if ((bVar2 == 0) || (bVar2 == 0x20)) {
LAB_001571d8:
          return (long)pbVar5 - (long)p;
        }
        goto LAB_001571c2;
      }
      pbVar1 = pbVar5 + 1;
LAB_00157147:
      pbVar4 = pbVar1;
      bVar2 = *pbVar4;
      if (bVar2 == 0x5c) break;
      if ((bVar2 != 0) && (lVar3 = 1, bVar2 != 0x22)) goto LAB_00157173;
      pbVar4 = pbVar4 + (1 - (long)pbVar5);
      if (bVar2 != 0x22) {
        pbVar4 = (byte *)0xffffffffffffffe7;
      }
      if ((long)pbVar4 < 0) {
        return -0x19;
      }
    }
    else {
      if (bVar2 == 0x5c) {
        bVar2 = pbVar5[1];
        pbVar4 = (byte *)0x2;
        if (bVar2 == 0) {
          pbVar5 = pbVar5 + 1;
          goto LAB_001571d8;
        }
      }
LAB_001571c2:
      archive_strappend_char(as,bVar2);
    }
    pbVar5 = pbVar5 + (long)pbVar4;
  } while( true );
  bVar2 = pbVar4[1];
  lVar3 = 2;
  pbVar1 = pbVar4 + 1;
  if (bVar2 != 0) {
LAB_00157173:
    archive_strappend_char(as,bVar2);
    pbVar1 = pbVar4 + lVar3;
  }
  goto LAB_00157147;
}

Assistant:

static ssize_t
get_argument(struct archive_string *as, const char *p)
{
	const char *s = p;

	archive_string_empty(as);

	/* Skip beginning space characters. */
	while (*s != '\0' && *s == ' ')
		s++;
	/* Copy non-space characters. */
	while (*s != '\0' && *s != ' ') {
		if (*s == '\\') {
			if (s[1] != '\0') {
				archive_strappend_char(as, s[1]);
				s += 2;
			} else {
				s++;/* Ignore this character.*/
				break;
			}
		} else if (*s == '"') {
			ssize_t q = extract_quotation(as, s);
			if (q < 0)
				return (ARCHIVE_FAILED);/* Invalid sequence. */
			s += q;
		} else {
			archive_strappend_char(as, s[0]);
			s++;
		}
	}
	return ((ssize_t)(s - p));
}